

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> * __thiscall
pstore::dump::array::writer<std::ostream>
          (array *this,basic_ostream<char,_std::char_traits<char>_> *os,indent *ind)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  element_type *peVar4;
  ostream *poVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  uint distance;
  bool local_7d;
  uint local_7c;
  __shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_78;
  value_ptr *value_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  container *__range3_1;
  __shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_50;
  value_ptr *value;
  const_iterator __end3;
  const_iterator __begin3;
  container *__range3;
  char *pcStack_28;
  bool is_compact;
  char *sep;
  indent *ind_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  array *this_local;
  
  pcStack_28 = "";
  sVar3 = std::
          vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
          ::size(&this->values_);
  local_7d = true;
  if (sVar3 != 0) {
    local_7d = is_number_array(this);
  }
  if (local_7d == false) {
    std::operator<<(os,'\n');
    __end3_1 = std::
               vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
               ::begin(&this->values_);
    value_1 = (value_ptr *)
              std::
              vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
              ::end(&this->values_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<const_std::shared_ptr<pstore::dump::value>_*,_std::vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>_>
                               *)&value_1), bVar1) {
      local_78 = (__shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)__gnu_cxx::
                    __normal_iterator<const_std::shared_ptr<pstore::dump::value>_*,_std::vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>_>
                    ::operator*(&__end3_1);
      poVar5 = std::operator<<(os,pcStack_28);
      poVar5 = dump::operator<<(poVar5,ind);
      std::operator<<(poVar5,"- ");
      peVar4 = std::
               __shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_78);
      peVar6 = std::
               __shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_78);
      iVar2 = (*peVar6->_vptr_value[2])();
      distance = 2;
      if (CONCAT44(extraout_var,iVar2) == 0) {
        distance = 4;
      }
      local_7c = (uint)indent::next(ind,distance);
      (*peVar4->_vptr_value[0x15])(peVar4,os,&local_7c);
      pcStack_28 = "\n";
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<pstore::dump::value>_*,_std::vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>_>
      ::operator++(&__end3_1);
    }
  }
  else {
    std::operator<<(os,"[");
    pcStack_28 = " ";
    __end3 = std::
             vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
             ::begin(&this->values_);
    value = (value_ptr *)
            std::
            vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
            ::end(&this->values_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::shared_ptr<pstore::dump::value>_*,_std::vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>_>
                                       *)&value), bVar1) {
      local_50 = (__shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)__gnu_cxx::
                    __normal_iterator<const_std::shared_ptr<pstore::dump::value>_*,_std::vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>_>
                    ::operator*(&__end3);
      std::operator<<(os,pcStack_28);
      peVar4 = std::
               __shared_ptr_access<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_50);
      memset((void *)((long)&__range3_1 + 4),0,4);
      indent::indent((indent *)((long)&__range3_1 + 4));
      (*peVar4->_vptr_value[0x15])(peVar4,os,(long)&__range3_1 + 4);
      pcStack_28 = ", ";
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<pstore::dump::value>_*,_std::vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>_>
      ::operator++(&__end3);
    }
    std::operator<<(os," ]");
  }
  return os;
}

Assistant:

OStream & array::writer (OStream & os, indent const & ind) const {
            char const * sep = "";

            bool const is_compact = values_.size () == 0 || this->is_number_array ();
            if (is_compact) {
                os << "[";
                sep = " ";
                for (value_ptr const & value : values_) {
                    os << sep;
                    value->write_impl (os, indent ());
                    sep = ", ";
                }
                os << " ]";
            } else {
                os << '\n';
                for (value_ptr const & value : values_) {
                    os << sep << ind << "- ";
                    value->write_impl (os,
                                       ind.next (value->dynamic_cast_object () == nullptr ? 4 : 2));
                    sep = "\n";
                }
            }
            return os;
        }